

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_timer.h
# Opt level: O2

void __thiscall c74::min::timer_base::tick(timer_base *this)

{
  atoms a;
  _Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_> local_20;
  
  a.super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  a.super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  a.super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Catch::clara::std::
  function<std::vector<c74::min::atom,_std::allocator<c74::min::atom>_>_(const_std::vector<c74::min::atom,_std::allocator<c74::min::atom>_>_&,_int)>
  ::operator()((vector<c74::min::atom,_std::allocator<c74::min::atom>_> *)&local_20,
               (function<std::vector<c74::min::atom,_std::allocator<c74::min::atom>_>_(const_std::vector<c74::min::atom,_std::allocator<c74::min::atom>_>_&,_int)>
                *)(this + 8),(vector<c74::min::atom,_std::allocator<c74::min::atom>_> *)&a,-1);
  std::_Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>::~_Vector_base(&local_20);
  std::_Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>::~_Vector_base
            (&a.super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>);
  return;
}

Assistant:

void tick_callback()
    {
        if (should_defer()) {
            defer();
        }
        else {
            tick();
        }
    }